

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

FMFieldList validate_and_copy_field_list(FMFieldList field_list,FMFormat_conflict fmformat)

{
  int iVar1;
  FMdata_type FVar2;
  int iVar3;
  FMFieldList str;
  char *pcVar4;
  long in_RSI;
  FMFieldList in_RDI;
  bool bVar5;
  FMdata_type base_type;
  long elements;
  int ret;
  int simple_string;
  int field_size;
  int field_count;
  FMFieldList new_field_list;
  int field;
  long *in_stack_000003f0;
  char *in_stack_000003f8;
  int local_48;
  FMdata_type in_stack_ffffffffffffffbc;
  FMFieldList in_stack_ffffffffffffffc0;
  int local_30;
  int local_1c;
  
  iVar1 = count_FMfield(in_RDI);
  str = (FMFieldList)ffs_malloc((size_t)in_stack_ffffffffffffffc0);
  local_1c = 0;
  do {
    if (iVar1 <= local_1c) {
      str[iVar1].field_name = (char *)0x0;
      str[iVar1].field_type = (char *)0x0;
      str[iVar1].field_size = 0;
      str[iVar1].field_offset = 0;
      *(int *)(in_RSI + 0x44) = iVar1;
      *(FMFieldList *)(in_RSI + 0x78) = str;
      qsort(*(void **)(in_RSI + 0x78),(long)iVar1,0x18,field_offset_compar);
      return str;
    }
    bVar5 = false;
    pcVar4 = strchr(in_RDI[local_1c].field_type,0x5b);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = strchr(in_RDI[local_1c].field_type,0x2a);
      if (pcVar4 == (char *)0x0) {
        FVar2 = FMstr_to_data_type((char *)str);
        bVar5 = FVar2 == string_type;
        local_30 = in_RDI[local_1c].field_size;
      }
      else {
        local_30 = *(int *)(in_RSI + 0x3c);
      }
    }
    else {
      iVar3 = is_var_array_field(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (iVar3 == -1) {
        return (FMFieldList)0x0;
      }
      if ((iVar3 == 1) || (pcVar4 = strchr(in_RDI[local_1c].field_type,0x2a), pcVar4 != (char *)0x0)
         ) {
        local_30 = *(int *)(in_RSI + 0x3c);
        if (local_30 < 1) {
          fprintf(_stderr,"Pointer Size is not positive! BAD! pointer size = %d\n",
                  (ulong)*(uint *)(in_RSI + 0x3c));
          return (FMFieldList)0x0;
        }
      }
      else {
        in_stack_ffffffffffffffbc = FMarray_str_to_data_type(in_stack_000003f8,in_stack_000003f0);
        if ((in_stack_ffffffffffffffbc != unknown_type) && (0x10 < in_RDI[local_1c].field_size)) {
          fprintf(_stderr,
                  "Field size for field %s in format %s is large, check to see if it is valid.\n",
                  in_RDI[local_1c].field_name,*(undefined8 *)(in_RSI + 0x10));
        }
        local_30 = in_RDI[local_1c].field_size * (int)in_stack_ffffffffffffffc0;
        if (local_30 < 1) {
          fprintf(_stderr,"Field Size is not positive!  field type \"%s\" base= %d, elements=%ld\n",
                  in_RDI[local_1c].field_type,(ulong)(uint)in_RDI[local_1c].field_size,
                  in_stack_ffffffffffffffc0);
          return (FMFieldList)0x0;
        }
        bVar5 = in_stack_ffffffffffffffbc == string_type;
      }
    }
    if (*(int *)(in_RSI + 0x30) < in_RDI[local_1c].field_offset + local_30) {
      local_48 = in_RDI[local_1c].field_offset + local_30;
    }
    else {
      local_48 = *(int *)(in_RSI + 0x30);
    }
    *(int *)(in_RSI + 0x30) = local_48;
    pcVar4 = strdup(in_RDI[local_1c].field_name);
    str[local_1c].field_name = pcVar4;
    if (*(int *)(*(long *)(in_RSI + 8) + 0x54) == 0) {
      field_name_strip_default((char *)in_stack_ffffffffffffffc0);
    }
    else {
      str[local_1c].field_name = str[local_1c].field_name;
    }
    pcVar4 = strdup(in_RDI[local_1c].field_type);
    str[local_1c].field_type = pcVar4;
    str[local_1c].field_size = in_RDI[local_1c].field_size;
    if (bVar5) {
      str[local_1c].field_size = 8;
    }
    str[local_1c].field_offset = in_RDI[local_1c].field_offset;
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

FMFieldList
validate_and_copy_field_list(FMFieldList field_list, FMFormat fmformat)
{
    int field;
    FMFieldList new_field_list;
    int field_count = count_FMfield(field_list);
    new_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
					     (field_count + 1));
    for (field = 0; field < field_count; field++) {
	int field_size = 0;
	int simple_string = 0;
	if (strchr(field_list[field].field_type, '[') == NULL) {
	    /* not an array */
	    if (strchr(field_list[field].field_type, '*') == NULL) {
		if (FMstr_to_data_type(field_list[field].field_type) == string_type) {
		    simple_string = 1;
		}
		field_size = field_list[field].field_size;
	    } else {
		field_size = fmformat->pointer_size;
	    }
	} else {
	    int ret = is_var_array_field(field_list, field);
	    if (ret == -1) return NULL;   /* rejected */
	    if ((ret == 1) || (strchr(field_list[field].field_type, '*'))) {
		/* variant array, real_field_size is
		 * fmc->pointer_size */
		field_size = fmformat->pointer_size;
		if (field_size <= 0) {
		    fprintf(stderr, "Pointer Size is not positive! BAD! pointer size = %d\n",
			    fmformat->pointer_size);
		    return NULL;
		}
	    } else {
		long elements;
		FMdata_type base_type;
		
		base_type = FMarray_str_to_data_type(field_list[field].field_type,
						   &elements);
		if ((base_type != unknown_type) &&
		    (field_list[field].field_size > 16)) {
		    fprintf(stderr, "Field size for field %s in format %s is large, check to see if it is valid.\n",
			    field_list[field].field_name, fmformat->format_name);
		}
		field_size = field_list[field].field_size * elements;
		if (field_size <= 0) {
		    fprintf(stderr, "Field Size is not positive!  field type \"%s\" base= %d, elements=%ld\n",
			    field_list[field].field_type,
			    field_list[field].field_size, elements);
		    return NULL;
		}
		if (base_type == string_type) {
		    simple_string = 1;
		}
	    }
	}

	fmformat->record_length = Max(fmformat->record_length,
					 field_list[field].field_offset +
					    field_size);
	new_field_list[field].field_name = strdup(field_list[field].field_name);
	if  (fmformat->context->ignore_default_values) {
	    new_field_list[field].field_name = new_field_list[field].field_name;
	} else {
	    field_name_strip_default((char *)new_field_list[field].field_name);
	}
	new_field_list[field].field_type = strdup(field_list[field].field_type);
	new_field_list[field].field_size = field_list[field].field_size;
	if (simple_string) {
	    new_field_list[field].field_size = sizeof(char*);
	}
	new_field_list[field].field_offset = field_list[field].field_offset;
    }
    new_field_list[field_count].field_name = NULL;
    new_field_list[field_count].field_type = NULL;
    new_field_list[field_count].field_size = 0;
    new_field_list[field_count].field_offset = 0;
    fmformat->field_count = field_count;
    fmformat->field_list = new_field_list;
    qsort(fmformat->field_list, field_count, sizeof(FMField),
	  field_offset_compar);
    return new_field_list;
}